

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O3

Ptr __thiscall core::image::subtract<float>(image *this,ConstPtr *i1,ConstPtr *i2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  element_type *peVar5;
  long *plVar6;
  pointer pfVar7;
  long lVar8;
  Image<float> *__p;
  invalid_argument *this_00;
  uint uVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  ulong uVar11;
  Ptr PVar12;
  
  peVar4 = (i2->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar4 == (element_type *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Null image given");
  }
  else {
    peVar5 = (i1->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar1 = (peVar5->super_TypedImageBase<float>).super_ImageBase.w;
    if (((iVar1 == (peVar4->super_TypedImageBase<float>).super_ImageBase.w) &&
        (iVar2 = (peVar5->super_TypedImageBase<float>).super_ImageBase.h,
        iVar2 == (peVar4->super_TypedImageBase<float>).super_ImageBase.h)) &&
       (iVar3 = (peVar5->super_TypedImageBase<float>).super_ImageBase.c,
       iVar3 == (peVar4->super_TypedImageBase<float>).super_ImageBase.c)) {
      __p = (Image<float> *)operator_new(0x30);
      (__p->super_TypedImageBase<float>).super_ImageBase.w = 0;
      (__p->super_TypedImageBase<float>).super_ImageBase.h = 0;
      (__p->super_TypedImageBase<float>).super_ImageBase.c = 0;
      (__p->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__p->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__p->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__p->super_TypedImageBase<float>).super_ImageBase._vptr_ImageBase =
           (_func_int **)&PTR__TypedImageBase_00128b60;
      *(Image<float> **)this = __p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<float>*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
      plVar6 = *(long **)this;
      (**(code **)(*plVar6 + 0x40))(plVar6);
      *(int *)(plVar6 + 1) = iVar1;
      *(int *)((long)plVar6 + 0xc) = iVar2;
      *(int *)(plVar6 + 2) = iVar3;
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)(plVar6 + 3),(long)(iVar2 * iVar1 * iVar3)
                );
      peVar4 = (i1->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      pfVar7 = (peVar4->super_TypedImageBase<float>).data.
               super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar9 = (uint)((ulong)((long)*(pointer *)
                                    ((long)&(peVar4->super_TypedImageBase<float>).data.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data + 8) - (long)pfVar7) >>
                    2);
      _Var10._M_pi = extraout_RDX;
      if (0 < (int)uVar9) {
        _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       (((i2->
                         super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->super_TypedImageBase<float>).data.
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
        lVar8 = *(long *)(*(long *)this + 0x18);
        uVar11 = 0;
        do {
          *(float *)(lVar8 + uVar11 * 4) =
               pfVar7[uVar11] -
               *(float *)((long)&(_Var10._M_pi)->_vptr__Sp_counted_base + uVar11 * 4);
          uVar11 = uVar11 + 1;
        } while ((uVar9 & 0x7fffffff) != uVar11);
      }
      PVar12.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var10._M_pi;
      PVar12.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (Ptr)PVar12.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Image dimensions do not match");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

typename Image<T>::Ptr
subtract (typename Image<T>::ConstPtr i1, typename Image<T>::ConstPtr i2)
{
    int const iw = i1->width();
    int const ih = i1->height();
    int const ic = i1->channels();

    if (i1 == nullptr || i2 == nullptr)
        throw std::invalid_argument("Null image given");

    if (iw != i2->width() || ih != i2->height() || ic != i2->channels())
        throw std::invalid_argument("Image dimensions do not match");

    typename Image<T>::Ptr out(Image<T>::create());
    out->allocate(iw, ih, ic);

    // FIXME: That needs speedup! STL algo with pointers.
    for (int i = 0; i < i1->get_value_amount(); ++i)
        out->at(i) = i1->at(i) - i2->at(i);

    return out;
}